

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O2

bool __thiscall p2t::Sweep::IsShallow(Sweep *this,SweepContext *tcx,Node *node)

{
  return *(double *)
          (**(long **)((long)&(tcx->basin).left_node + (ulong)(((tcx->basin).left_highest ^ 1) << 4)
                      ) + 8) - node->point->y < (tcx->basin).width;
}

Assistant:

bool Sweep::IsShallow(SweepContext& tcx, Node& node)
{
  double height;

  if (tcx.basin.left_highest) {
    height = tcx.basin.left_node->point->y - node.point->y;
  } else {
    height = tcx.basin.right_node->point->y - node.point->y;
  }

  // if shallow stop filling
  if (tcx.basin.width > height) {
    return true;
  }
  return false;
}